

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test_deduction(void)

{
  int iVar1;
  assertion_failed *this;
  small_function<int_()_noexcept,_8UL,_8UL> fn2;
  small_function<void_(),_8UL,_8UL> fn;
  small_function<int_()_noexcept,_8UL,_8UL> fn5;
  
  fn.super_dispatch_t<void_(),_8UL,_8UL>._vtable =
       (vtable_t<void> *)
       &
       _ZZN6avakar15_small_function4implILm8ELm8ELb0EvJEEC1IPFvvETnNSt9enable_ifIXaaaaaasr3stdE25is_nothrow_destructible_vIT_Esr3stdE31is_nothrow_move_constructible_vIS7_EquLb0Esr3stdE24is_nothrow_invocable_r_vIvRS7_Esr3stdE16is_invocable_r_vIvS8_E17fits_in_storage_vIX13real_sizeof_vIS7_EEXatS7_ELm8ELm8EEEiE4typeELi0EEES7_E6vtable
  ;
  fn.super_dispatch_t<void_(),_8UL,_8UL>.super_storage_t<8UL,_8UL>._bytes =
       (byte  [8])test_deduction;
  fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>._vtable =
       (vtable_t<int> *)
       &
       _ZZN6avakar15_small_function4implILm8ELm8ELb1EiJEEC1IPDoFivETnNSt9enable_ifIXaaaaaasr3stdE25is_nothrow_destructible_vIT_Esr3stdE31is_nothrow_move_constructible_vIS7_EquLb1Esr3stdE24is_nothrow_invocable_r_vIiRS7_Esr3stdE16is_invocable_r_vIiS8_E17fits_in_storage_vIX13real_sizeof_vIS7_EEXatS7_ELm8ELm8EEEiE4typeELi0EEES7_E6vtable
  ;
  fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>.super_storage_t<8UL,_8UL>._bytes =
       (byte  [8])_noexcept_fn;
  iVar1 = avakar::_small_function::impl<8UL,_8UL,_true,_int>::operator()
                    (&fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>);
  if (iVar1 == 0x2b) {
    avakar::_small_function::impl<8UL,_8UL,_true,_int>::impl
              (&fn5.super_dispatch_t<int_()_noexcept,_8UL,_8UL>,
               &fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>);
    if (fn5.super_dispatch_t<int_()_noexcept,_8UL,_8UL>._vtable != (vtable_t<int> *)0x0) {
      (*(fn5.super_dispatch_t<int_()_noexcept,_8UL,_8UL>._vtable)->destroy)((byte *)&fn5);
    }
    if (fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>._vtable != (vtable_t<int> *)0x0) {
      (*(fn2.super_dispatch_t<int_()_noexcept,_8UL,_8UL>._vtable)->destroy)((byte *)&fn2);
    }
    if (fn.super_dispatch_t<void_(),_8UL,_8UL>._vtable != (vtable_t<void> *)0x0) {
      (*(fn.super_dispatch_t<void_(),_8UL,_8UL>._vtable)->destroy)((byte *)&fn);
    }
    return;
  }
  this = (assertion_failed *)__cxa_allocate_exception(0x10);
  assertion_failed::runtime_error
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/avakar[P]small_function/test/test.cpp(115): assertion failed: fn2() == 43"
            );
  __cxa_throw(this,&assertion_failed::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void test_noexcept_convertion()
{
	small_function<int()> fn;
	small_function<int() noexcept> fn2 = []() noexcept { return 42; };
	require(fn2);
	require(fn2() == 42);

	fn = std::move(fn2);
	require(fn);
	require(!fn2);
	require(fn() == 42);
}